

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v8::detail::vformat_to<char8_t>
               (buffer<char8_t> *buf,basic_string_view<char8_t> fmt,
               basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
               args,locale_ref loc)

{
  char8_t *last;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out;
  undefined1 value [16];
  undefined1 value_00 [16];
  char *pcVar1;
  bool bVar2;
  char8_t *pbegin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
  aVar3;
  float value_01;
  type tVar4;
  char8_t *end;
  char8_t *end_00;
  undefined8 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  char8_t *local_80;
  undefined1 local_78 [32];
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_58;
  char8_t *local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
  local_48;
  locale_ref local_40;
  writer write;
  
  local_78._16_8_ = args.field_1;
  local_78._8_8_ = args.desc_;
  aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
           )fmt.size_;
  pbegin = fmt.data_;
  if (((aVar3.values_ ==
        (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
         *)0x2) && (*pbegin == '{')) && (pbegin[1] == '}')) {
    if ((long)local_78._8_8_ < 0) {
      if (((int)(type)args.desc_ < 1) ||
         (tVar4 = ((format_arg *)local_78._16_8_)->type_, tVar4 == none_type)) goto LAB_0011b78a;
    }
    else {
      tVar4 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0011b78a:
        ::fmt::v8::detail::throw_format_error("argument not found");
      }
    }
    out.container =
         *(buffer<char8_t> **)
          &((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
             *)local_78._16_8_)->field_0;
    value_01 = SUB84(out.container,0);
    local_78._0_8_ = buf;
    local_78._24_8_ = loc.locale_;
    switch(tVar4) {
    case int_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_int,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,(int)value_01);
      break;
    case uint_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_unsigned_int,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,(uint)value_01);
      break;
    case long_long_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_long_long,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,
                 (longlong)out.container);
      break;
    case ulong_long_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_unsigned_long_long,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,
                 (unsigned_long_long)out.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff70;
      value._0_8_ = in_stack_ffffffffffffff68;
      value._10_6_ = in_stack_ffffffffffffff72;
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,___int128,_0>
                ((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff70;
      value_00._0_8_ = in_stack_ffffffffffffff68;
      value_00._10_6_ = in_stack_ffffffffffffff72;
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char8_t>::operator()
                ((default_arg_formatter<char8_t> *)local_78,(bool)((byte)out.container & 1));
      break;
    case char_type:
      write<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,(byte)out.container);
      break;
    case float_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_float,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,value_01);
      break;
    case double_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_double,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,(double)out.container)
      ;
      break;
    case last_numeric_type:
      write<char8_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_long_double,_0>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,
                 (((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
                    *)local_78._16_8_)->field_0).long_double_value);
      break;
    case cstring_type:
      write<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf,
                 (char8_t *)out.container);
      break;
    case string_type:
      copy_str_noinline<char8_t,char8_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                ((char8_t *)out.container,
                 (char8_t *)
                 ((((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
                     *)local_78._16_8_)->field_0).custom.format + (long)out.container),
                 (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)buf);
      break;
    case pointer_type:
      default_arg_formatter<char8_t>::operator()
                ((default_arg_formatter<char8_t> *)local_78,out.container);
      break;
    case custom_type:
      default_arg_formatter<char8_t>::operator()
                ((default_arg_formatter<char8_t> *)local_78,
                 (handle)(((value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>
                            *)local_78._16_8_)->field_0).string);
      break;
    default:
      default_arg_formatter<char8_t>::operator()((default_arg_formatter<char8_t> *)local_78);
    }
  }
  else {
    local_78._24_8_ = local_78._24_8_ & 0xffffffff00000000;
    last = pbegin + (long)aVar3.values_;
    end_00 = pbegin;
    local_40.locale_ = loc.locale_;
    local_48 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
                )local_78._16_8_;
    local_50 = (char8_t *)local_78._8_8_;
    local_58.container = buf;
    pcVar1 = pbegin;
    if ((long)aVar3.values_ < 0x20) {
      while (local_78._8_8_ = pcVar1, local_78._16_8_ = aVar3, end = end_00, end != last) {
        end_00 = end + 1;
        if (*end == '}') {
          if ((end_00 == last) || (*end_00 != '}')) {
            ::fmt::v8::detail::throw_format_error("unmatched \'}\' in format string");
          }
          vformat_to<char8_t>::format_handler::on_text((format_handler *)local_78,pbegin,end_00);
          pbegin = end + 2;
          end_00 = pbegin;
          aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
                   )local_78._16_8_;
          pcVar1 = (char *)local_78._8_8_;
        }
        else {
          aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
                   )local_78._16_8_;
          pcVar1 = (char *)local_78._8_8_;
          if (*end == '{') {
            vformat_to<char8_t>::format_handler::on_text((format_handler *)local_78,pbegin,end);
            pbegin = parse_replacement_field<char8_t,fmt::v8::detail::vformat_to<char8_t>(fmt::v8::detail::buffer<char8_t>&,fmt::v8::basic_string_view<char8_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char8_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char8_t>::type>>>::type,fmt::v8::type_identity<char8_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                               (end,last,(format_handler *)local_78);
            end_00 = pbegin;
            aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
                     )local_78._16_8_;
            pcVar1 = (char *)local_78._8_8_;
          }
        }
      }
      vformat_to<char8_t>::format_handler::on_text((format_handler *)local_78,pbegin,last);
    }
    else {
      write.handler_ = (format_handler *)local_78;
      while (local_78._16_8_ = aVar3, local_78._8_8_ = pcVar1, pbegin != last) {
        local_80 = pbegin;
        if ((*pbegin != '{') &&
           (bVar2 = find<false,char8_t,char8_t_const*>(pbegin + 1,last,'{',&local_80), !bVar2)) {
          parse_format_string<false,_char8_t,_format_handler>::writer::operator()
                    (&write,pbegin,last);
          return;
        }
        parse_format_string<false,_char8_t,_format_handler>::writer::operator()
                  (&write,pbegin,local_80);
        pbegin = parse_replacement_field<char8_t,fmt::v8::detail::vformat_to<char8_t>(fmt::v8::detail::buffer<char8_t>&,fmt::v8::basic_string_view<char8_t>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char8_t>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char8_t>::type>>>::type,fmt::v8::type_identity<char8_t>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                           (local_80,last,(format_handler *)local_78);
        pcVar1 = (char *)local_78._8_8_;
        aVar3 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>_>_2
                 )local_78._16_8_;
      }
    }
  }
  return;
}

Assistant:

void vformat_to(
    buffer<Char>& buf, basic_string_view<Char> fmt,
    basic_format_args<FMT_BUFFER_CONTEXT(type_identity_t<Char>)> args,
    locale_ref loc) {
  // workaround for msvc bug regarding name-lookup in module
  // link names into function scope
  using detail::arg_formatter;
  using detail::buffer_appender;
  using detail::custom_formatter;
  using detail::default_arg_formatter;
  using detail::get_arg;
  using detail::locale_ref;
  using detail::parse_format_specs;
  using detail::specs_checker;
  using detail::specs_handler;
  using detail::to_unsigned;
  using detail::type;
  using detail::write;
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> args, locale_ref loc)
        : parse_context(str), context(out, args, loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(parse_context.begin() +
                                 (begin - &*parse_context.begin()));
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = basic_format_specs<Char>();
      specs_checker<specs_handler<Char>> handler(
          specs_handler<Char>(specs, parse_context, context), arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}